

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

void google::protobuf::compiler::php::GenerateHead(FileDescriptor *file,Printer *printer)

{
  FileDescriptor *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000038;
  char (*in_stack_00000040) [9];
  char *in_stack_00000048;
  Printer *in_stack_00000050;
  
  FileDescriptor::name_abi_cxx11_(in_RDI);
  io::Printer::Print<char[9],std::__cxx11::string>
            (in_stack_00000050,in_stack_00000048,in_stack_00000040,in_stack_00000038);
  return;
}

Assistant:

void GenerateHead(const FileDescriptor* file, io::Printer* printer) {
  printer->Print(
    "<?php\n"
    "# Generated by the protocol buffer compiler.  DO NOT EDIT!\n"
    "# source: ^filename^\n"
    "\n",
    "filename", file->name());
}